

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O0

void stage_decode(Emulator *e)

{
  int iVar1;
  undefined8 uVar2;
  State *pSVar3;
  _Bool _Var4;
  undefined3 uVar5;
  StageID *pSVar6;
  Instr instr_00;
  Op OStack_4c;
  Instr instr;
  StageEX *ex;
  StageID *id;
  Emulator *e_local;
  
  pSVar6 = &(e->state).pipeline.id;
  pSVar3 = &e->state;
  if (((e->state).pipeline.id.s.active & 1U) != 0) {
    instr_00 = decode((e->state).pc - 2,(u16)(e->state).pipeline.id.code);
    _Var4 = (pSVar6->s).active;
    uVar5 = *(undefined3 *)&(pSVar6->s).field_0x5;
    iVar1 = (e->state).pipeline.id.s.step;
    OStack_4c = instr_00.op;
    (pSVar3->pipeline).ex.s.iaddr = (pSVar6->s).iaddr;
    (pSVar3->pipeline).ex.s.active = _Var4;
    *(undefined3 *)&(pSVar3->pipeline).ex.s.field_0x5 = uVar5;
    *(ulong *)&(e->state).pipeline.ex.s.step = CONCAT44(OStack_4c,iVar1);
    uVar2 = instr_00._4_8_;
    pSVar3 = &e->state;
    (pSVar3->pipeline).ex.instr.n = (char)uVar2;
    (pSVar3->pipeline).ex.instr.m = (char)((ulong)uVar2 >> 8);
    (pSVar3->pipeline).ex.instr.pad = (char)((ulong)uVar2 >> 0x10);
    (pSVar3->pipeline).ex.instr.field_0x7 = (char)((ulong)uVar2 >> 0x18);
    (pSVar3->pipeline).ex.instr.field_4 =
         (anon_union_4_2_94730066_for_Instr_4)(int)((ulong)uVar2 >> 0x20);
    (e->state).pipeline.id.s.active = false;
    if (1 < e->verbosity) {
      print_stage(pSVar6->s,"decode");
      printf("      0x%04x => ",(ulong)(e->state).pipeline.id.code);
      print_instr(e,instr_00,false);
      printf("\n");
    }
  }
  return;
}

Assistant:

void stage_decode(Emulator* e) {
  StageID* id = &e->state.pipeline.id;
  StageEX* ex = &e->state.pipeline.ex;

  if (!id->s.active) {
    return;
  }

  Instr instr = decode(e->state.pc - 2, id->code);
  *ex = (StageEX){.s = id->s, .instr = instr};

  id->s.active = false;

  if (e->verbosity > 1) {
    print_stage(id->s, "decode");
    printf("      0x%04x => ", id->code);
    print_instr(e, instr, false);
    printf("\n");
  }
}